

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::IPCFrame_BindServiceReply::~IPCFrame_BindServiceReply
          (IPCFrame_BindServiceReply *this)

{
  IPCFrame_BindServiceReply *this_local;
  
  ~IPCFrame_BindServiceReply(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

IPCFrame_BindServiceReply::~IPCFrame_BindServiceReply() = default;